

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderSetStructuredErrorHandler
               (xmlTextReaderPtr reader,xmlStructuredErrorFunc f,void *arg)

{
  void *arg_local;
  xmlStructuredErrorFunc f_local;
  xmlTextReaderPtr reader_local;
  
  if (f == (xmlStructuredErrorFunc)0x0) {
    reader->errorFunc = (xmlTextReaderErrorFunc)0x0;
    reader->sErrorFunc = (xmlStructuredErrorFunc)0x0;
    reader->errorFuncArg = (void *)0x0;
    xmlCtxtSetErrorHandler(reader->ctxt,(xmlStructuredErrorFunc)0x0,(void *)0x0);
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      xmlRelaxNGSetValidStructuredErrors
                (reader->rngValidCtxt,(xmlStructuredErrorFunc)0x0,(void *)0x0);
    }
    if (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0) {
      xmlSchemaSetValidStructuredErrors
                (reader->xsdValidCtxt,(xmlStructuredErrorFunc)0x0,(void *)0x0);
    }
  }
  else {
    reader->sErrorFunc = f;
    reader->errorFunc = (xmlTextReaderErrorFunc)0x0;
    reader->errorFuncArg = arg;
    xmlCtxtSetErrorHandler(reader->ctxt,xmlTextReaderStructuredRelay,reader);
    if (reader->rngValidCtxt != (xmlRelaxNGValidCtxtPtr)0x0) {
      xmlRelaxNGSetValidStructuredErrors(reader->rngValidCtxt,xmlTextReaderStructuredRelay,reader);
    }
    if (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0) {
      xmlSchemaSetValidStructuredErrors(reader->xsdValidCtxt,xmlTextReaderStructuredRelay,reader);
    }
  }
  return;
}

Assistant:

void
xmlTextReaderSetStructuredErrorHandler(xmlTextReaderPtr reader,
                                       xmlStructuredErrorFunc f, void *arg)
{
    if (f != NULL) {
        reader->sErrorFunc = f;
        reader->errorFunc = NULL;
        reader->errorFuncArg = arg;
        xmlCtxtSetErrorHandler(reader->ctxt,
                xmlTextReaderStructuredRelay, reader);
#ifdef LIBXML_SCHEMAS_ENABLED
        if (reader->rngValidCtxt) {
            xmlRelaxNGSetValidStructuredErrors(reader->rngValidCtxt,
                    xmlTextReaderStructuredRelay, reader);
        }
        if (reader->xsdValidCtxt) {
            xmlSchemaSetValidStructuredErrors(reader->xsdValidCtxt,
                    xmlTextReaderStructuredRelay, reader);
        }
#endif
    } else {
        /* restore defaults */
        reader->errorFunc = NULL;
        reader->sErrorFunc = NULL;
        reader->errorFuncArg = NULL;
        xmlCtxtSetErrorHandler(reader->ctxt, NULL, NULL);
#ifdef LIBXML_SCHEMAS_ENABLED
        if (reader->rngValidCtxt) {
            xmlRelaxNGSetValidStructuredErrors(reader->rngValidCtxt, NULL,
                                               NULL);
        }
        if (reader->xsdValidCtxt) {
            xmlSchemaSetValidStructuredErrors(reader->xsdValidCtxt, NULL,
                                              NULL);
        }
#endif
    }
}